

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O2

XrResult RuntimeManifestFile::FindManifestFiles
                   (string *openxr_command,
                   vector<std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>,_std::allocator<std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>_>_>
                   *manifest_files)

{
  bool bVar1;
  istream *piVar2;
  string *in_RCX;
  string *psVar3;
  XrResult XVar4;
  allocator local_269;
  string dir_prefix;
  string result;
  string filename;
  char *local_1f0;
  size_type local_1e8;
  char local_1e0 [8];
  undefined8 uStack_1d8;
  string message;
  istringstream iss;
  
  PlatformUtilsGetSecureEnv_abi_cxx11_(&filename,"XR_RUNTIME_JSON");
  if (filename._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,
                   "RuntimeManifestFile::FindManifestFiles - using environment variable override runtime file "
                   ,&filename);
    result._M_dataplus._M_p = (pointer)0x0;
    result._M_string_length = 0;
    result.field_2._M_allocated_capacity = 0;
    LoaderLogger::LogInfoMessage
              (openxr_command,(string *)&iss,
               (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&result);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
              ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&result);
    psVar3 = (string *)&iss;
    goto LAB_00112ac0;
  }
  std::__cxx11::string::string
            ((string *)&message,"Looking for active_runtime.x86_64.json or active_runtime.json",
             (allocator *)&iss);
  PlatformUtilsGetSecureEnv_abi_cxx11_(&dir_prefix,"XDG_CONFIG_HOME");
  if (dir_prefix._M_string_length == 0) {
    PlatformUtilsGetSecureEnv_abi_cxx11_((string *)&iss,"HOME");
    std::__cxx11::string::operator=((string *)&dir_prefix,(string *)&iss);
    std::__cxx11::string::~string((string *)&iss);
    if (dir_prefix._M_string_length != 0) {
      std::__cxx11::string::append((char *)&dir_prefix);
      std::__cxx11::string::append((char *)&dir_prefix);
      if (dir_prefix._M_string_length != 0) goto LAB_0011280a;
    }
LAB_001128b4:
    PlatformUtilsGetSecureEnv_abi_cxx11_(&result,"XDG_CONFIG_DIRS");
    if (result._M_string_length == 0) {
      std::__cxx11::string::string((string *)&local_1f0,"/etc/xdg",&local_269);
    }
    else {
      local_1f0 = local_1e0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p == &result.field_2) {
        uStack_1d8 = result.field_2._8_8_;
      }
      else {
        local_1f0 = result._M_dataplus._M_p;
      }
      local_1e8 = result._M_string_length;
      result._M_string_length = 0;
      result.field_2._M_allocated_capacity =
           result.field_2._M_allocated_capacity & 0xffffffffffffff00;
      result._M_dataplus._M_p = (pointer)&result.field_2;
    }
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&local_1f0,_S_in);
    std::__cxx11::string::~string((string *)&local_1f0);
    result._M_dataplus._M_p = (pointer)&result.field_2;
    result._M_string_length = 0;
    result.field_2._M_allocated_capacity = result.field_2._M_allocated_capacity & 0xffffffffffffff00
    ;
    do {
      do {
        piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&iss,(string *)&result,':');
        psVar3 = *(string **)(*(long *)piVar2 + -0x18);
        if (((byte)(piVar2 + 0x20)[(long)psVar3] & 5) != 0) {
          std::__cxx11::string::assign((char *)&dir_prefix);
          std::__cxx11::string::append((char *)&dir_prefix);
          std::__cxx11::string::append((char *)&dir_prefix);
          bVar1 = FindEitherActiveRuntimeFilename
                            ("compiled-in SYSCONFDIR",&dir_prefix,(uint16_t)&filename,psVar3);
          if (!bVar1) {
            std::__cxx11::string::assign((char *)&dir_prefix);
            std::__cxx11::string::append((char *)&dir_prefix);
            std::__cxx11::string::append((char *)&dir_prefix);
            bVar1 = FindEitherActiveRuntimeFilename
                              ("compiled-in EXTRASYSCONFDIR",&dir_prefix,(uint16_t)&filename,psVar3)
            ;
            if (!bVar1) {
              filename._M_string_length = 0;
              *filename._M_dataplus._M_p = '\0';
              std::__cxx11::string::~string((string *)&result);
              std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
              std::__cxx11::string::~string((string *)&dir_prefix);
              std::__cxx11::string::~string((string *)&message);
              std::__cxx11::string::string
                        ((string *)&iss,
                         "RuntimeManifestFile::FindManifestFiles - failed to determine active runtime file path for this environment"
                         ,(allocator *)&message);
              result._M_dataplus._M_p = (pointer)0x0;
              result._M_string_length = 0;
              result.field_2._M_allocated_capacity = 0;
              LoaderLogger::LogErrorMessage
                        (openxr_command,(string *)&iss,
                         (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&result)
              ;
              std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                        ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&result)
              ;
              std::__cxx11::string::~string((string *)&iss);
              XVar4 = XR_ERROR_RUNTIME_UNAVAILABLE;
              goto LAB_00112ad9;
            }
          }
          goto LAB_00112a97;
        }
      } while (result._M_string_length == 0);
      std::__cxx11::string::operator=((string *)&dir_prefix,(string *)&result);
      std::__cxx11::string::append((char *)&dir_prefix);
      std::__cxx11::string::append((char *)&dir_prefix);
      bVar1 = FindEitherActiveRuntimeFilename
                        ("an entry of XDG_CONFIG_DIRS",&dir_prefix,(uint16_t)&filename,psVar3);
    } while (!bVar1);
LAB_00112a97:
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  }
  else {
LAB_0011280a:
    std::__cxx11::string::append((char *)&dir_prefix);
    std::__cxx11::string::append((char *)&dir_prefix);
    bVar1 = FindEitherActiveRuntimeFilename
                      ("XDG_CONFIG_HOME",&dir_prefix,(uint16_t)&filename,in_RCX);
    if (!bVar1) goto LAB_001128b4;
  }
  std::__cxx11::string::~string((string *)&dir_prefix);
  psVar3 = &message;
LAB_00112ac0:
  std::__cxx11::string::~string((string *)psVar3);
  XVar4 = XR_SUCCESS;
  CreateIfValid(&filename,manifest_files);
LAB_00112ad9:
  std::__cxx11::string::~string((string *)&filename);
  return XVar4;
}

Assistant:

XrResult RuntimeManifestFile::FindManifestFiles(const std::string &openxr_command,
                                                std::vector<std::unique_ptr<RuntimeManifestFile>> &manifest_files) {
    XrResult result = XR_SUCCESS;
    std::string filename = PlatformUtilsGetSecureEnv(OPENXR_RUNTIME_JSON_ENV_VAR);
    if (!filename.empty()) {
        LoaderLogger::LogInfoMessage(
            openxr_command,
            "RuntimeManifestFile::FindManifestFiles - using environment variable override runtime file " + filename);
    } else {
#ifdef XR_OS_WINDOWS
        std::vector<std::string> filenames;
        ReadRuntimeDataFilesInRegistry("", "ActiveRuntime", filenames);
        if (filenames.size() == 0) {
            LoaderLogger::LogErrorMessage(
                openxr_command, "RuntimeManifestFile::FindManifestFiles - failed to find active runtime file in registry");
            return XR_ERROR_RUNTIME_UNAVAILABLE;
        }
        if (filenames.size() > 1) {
            LoaderLogger::LogWarningMessage(
                openxr_command, "RuntimeManifestFile::FindManifestFiles - found too many default runtime files in registry");
        }
        filename = filenames[0];
        LoaderLogger::LogInfoMessage(openxr_command,
                                     "RuntimeManifestFile::FindManifestFiles - using registry-specified runtime file " + filename);
#elif defined(XR_OS_LINUX)

        if (!FindXDGConfigFile("openxr/", XR_VERSION_MAJOR(XR_CURRENT_API_VERSION), filename)) {
            LoaderLogger::LogErrorMessage(
                openxr_command,
                "RuntimeManifestFile::FindManifestFiles - failed to determine active runtime file path for this environment");
            return XR_ERROR_RUNTIME_UNAVAILABLE;
        }
#else  // !defined(XR_OS_WINDOWS) && !defined(XR_OS_LINUX)

#if defined(XR_KHR_LOADER_INIT_SUPPORT) && defined(XR_USE_PLATFORM_ANDROID)
        Json::Value virtualManifest;
        result = GetPlatformRuntimeVirtualManifest(virtualManifest);
        if (XR_SUCCESS == result) {
            RuntimeManifestFile::CreateIfValid(virtualManifest, "", manifest_files);
            return result;
        }
#endif  // defined(XR_USE_PLATFORM_ANDROID) && defined(XR_KHR_LOADER_INIT_SUPPORT)
        if (!PlatformGetGlobalRuntimeFileName(XR_VERSION_MAJOR(XR_CURRENT_API_VERSION), filename)) {
            LoaderLogger::LogErrorMessage(
                openxr_command,
                "RuntimeManifestFile::FindManifestFiles - failed to determine active runtime file path for this environment");
            return XR_ERROR_RUNTIME_UNAVAILABLE;
        }
        result = XR_SUCCESS;
        LoaderLogger::LogInfoMessage(openxr_command,
                                     "RuntimeManifestFile::FindManifestFiles - using global runtime file " + filename);
#endif  // !defined(XR_OS_WINDOWS) && !defined(XR_OS_LINUX)
    }
    RuntimeManifestFile::CreateIfValid(filename, manifest_files);

    return result;
}